

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodeList.h
# Opt level: O0

void __thiscall
psy::C::
CoreSyntaxNodeList<psy::C::DesignatorSyntax*,psy::C::SyntaxNodePlainList<psy::C::DesignatorSyntax*>>
::acceptVisitor(CoreSyntaxNodeList<psy::C::DesignatorSyntax*,psy::C::SyntaxNodePlainList<psy::C::DesignatorSyntax*>>
                *this)

{
  SyntaxVisitor *in_RSI;
  
  CoreSyntaxNodeList<psy::C::DesignatorSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DesignatorSyntax_*>_>
  ::acceptVisitor((CoreSyntaxNodeList<psy::C::DesignatorSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DesignatorSyntax_*>_>
                   *)(this + -0x18),in_RSI);
  return;
}

Assistant:

virtual SyntaxVisitor::Action acceptVisitor(SyntaxVisitor* visitor) override
    {
        for (auto it = this; it; it = it->next) {
            SyntaxNodeT node = static_cast<SyntaxNodeT>(it->value);
            if (node) {
                auto action = node->acceptVisitor(visitor);
                if (action == SyntaxVisitor::Action::Quit)
                    return action;
            }
        }
        return SyntaxVisitor::Action::Visit;
    }